

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpc_test.cpp
# Opt level: O1

void __thiscall json_service::sum(json_service *this,int x,int y)

{
  ostream *poVar1;
  runtime_error *this_00;
  ostringstream oss;
  int local_1b0 [8];
  value local_190 [47];
  
  if (y != 10) {
    local_1b0[0] = y + x;
    cppcms::json::value::value<int>(local_190,local_1b0);
    cppcms::rpc::json_rpc_server::return_result((value *)this);
    cppcms::json::value::copyable::~copyable(&local_190[0].d);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/jsonrpc_test.cpp"
             ,0x5f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x3d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," y!=10",6);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,(string *)local_1b0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void sum(int x,int y)
	{
        TEST(y!=10);
		return_result(x+y);
	}